

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gls::BindHoleAttributeTest::iterate(BindHoleAttributeTest *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  long *plVar5;
  size_type *psVar6;
  int iVar7;
  deUint32 dVar8;
  string local_2f8;
  deUint32 local_2d4;
  BindHoleAttributeTest *local_2d0;
  long *local_2c8 [2];
  long local_2b8 [2];
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  Attribute local_288;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  bindings;
  AttribType vec4;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  ostringstream s;
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d0 = this;
  local_2d4 = anon_unknown_1::getMaxAttributeLocations(this->m_renderCtx);
  puVar1 = &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&s,"vec4","");
  vec4.m_name._M_dataplus._M_p = (pointer)&vec4.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&vec4,
             s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
             s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
             (long)s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream);
  vec4.m_locationSize = 1;
  vec4.m_glTypeEnum = 0x8b52;
  if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)puVar1) {
    operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  iVar7 = 1;
  if (local_2d0->m_arraySize != -1) {
    iVar7 = local_2d0->m_arraySize;
  }
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"a_0","");
  puVar2 = (undefined1 *)((long)&local_288.m_type.m_name.field_2 + 8);
  local_288.m_type.m_name._M_dataplus._M_p._0_1_ = 1;
  local_288.m_type.m_name.field_2._8_8_ = 0x737961776c615f5f;
  local_288.m_type.m_name.field_2._M_allocated_capacity = 10;
  local_288.m_type.m_locationSize = CONCAT13(local_288.m_type.m_locationSize._3_1_,0x5f5f);
  local_288.m_type.m_name._M_string_length = (size_type)puVar2;
  AttributeLocationTestUtil::Attribute::Attribute
            ((Attribute *)&s,&vec4,&local_2f8,-1,(Cond *)&local_288,-1);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,(Attribute *)&s);
  puVar3 = &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x68;
  if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._88_8_ != puVar3) {
    operator_delete((void *)s.super_basic_ostream<char,_std::char_traits<char>_>._88_8_,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._104_8_ + 1);
  }
  puVar4 = &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x38;
  if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != puVar4) {
    operator_delete((void *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ + 1);
  }
  if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)puVar1) {
    operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  if ((undefined1 *)local_288.m_type.m_name._M_string_length != puVar2) {
    operator_delete((void *)local_288.m_type.m_name._M_string_length,
                    local_288.m_type.m_name.field_2._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  local_288.m_type.m_name._M_dataplus._M_p = (pointer)&local_288.m_type.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"a_0","");
  s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&s,local_288.m_type.m_name._M_dataplus._M_p,
             (undefined1 *)
             (local_288.m_type.m_name._M_string_length +
             (long)local_288.m_type.m_name._M_dataplus._M_p));
  s.super_basic_ostream<char,_std::char_traits<char>_>._32_4_ = 0;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&s);
  if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)puVar1) {
    operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_type.m_name._M_dataplus._M_p != &local_288.m_type.m_name.field_2) {
    operator_delete(local_288.m_type.m_name._M_dataplus._M_p,
                    local_288.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"a_1","");
  local_288.m_type.m_name._M_dataplus._M_p._0_1_ = 1;
  local_288.m_type.m_name.field_2._8_8_ = 0x737961776c615f5f;
  local_288.m_type.m_name.field_2._M_allocated_capacity = 10;
  local_288.m_type.m_locationSize = CONCAT13(local_288.m_type.m_locationSize._3_1_,0x5f5f);
  local_288.m_type.m_name._M_string_length = (size_type)puVar2;
  AttributeLocationTestUtil::Attribute::Attribute
            ((Attribute *)&s,&local_2d0->m_type,&local_2f8,-1,(Cond *)&local_288,
             local_2d0->m_arraySize);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,(Attribute *)&s);
  if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._88_8_ != puVar3) {
    operator_delete((void *)s.super_basic_ostream<char,_std::char_traits<char>_>._88_8_,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._104_8_ + 1);
  }
  if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != puVar4) {
    operator_delete((void *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ + 1);
  }
  if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)puVar1) {
    operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  if ((undefined1 *)local_288.m_type.m_name._M_string_length != puVar2) {
    operator_delete((void *)local_288.m_type.m_name._M_string_length,
                    local_288.m_type.m_name.field_2._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  dVar8 = iVar7 * (local_2d0->m_type).m_locationSize + 1;
  if ((int)dVar8 < (int)local_2d4) {
    puVar1 = &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18;
    iVar7 = 2;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::operator<<((Cond *)&s,iVar7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base
                ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_2c8,0,(char *)0x0,0x1cb8d10);
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_2f8.field_2._M_allocated_capacity = *psVar6;
        local_2f8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_2f8.field_2._M_allocated_capacity = *psVar6;
        local_2f8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_2f8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           CONCAT71(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._1_7_,1
                   );
      s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0x737961776c615f5f;
      s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 10;
      s.super_basic_ostream<char,_std::char_traits<char>_>._32_3_ = 0x5f5f;
      s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = puVar1;
      AttributeLocationTestUtil::Attribute::Attribute(&local_288,&vec4,&local_2f8,-1,(Cond *)&s,-1);
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.m_cond.m_name._M_dataplus._M_p != &local_288.m_cond.m_name.field_2) {
        operator_delete(local_288.m_cond.m_name._M_dataplus._M_p,
                        local_288.m_cond.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.m_name._M_dataplus._M_p != &local_288.m_name.field_2) {
        operator_delete(local_288.m_name._M_dataplus._M_p,
                        local_288.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.m_type.m_name._M_dataplus._M_p != &local_288.m_type.m_name.field_2) {
        operator_delete(local_288.m_type.m_name._M_dataplus._M_p,
                        local_288.m_type.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != puVar1) {
        operator_delete((void *)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_,
                        s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if (local_2c8[0] != local_2b8) {
        operator_delete(local_2c8[0],local_2b8[0] + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::operator<<((Cond *)&s,iVar7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base
                ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_2c8,0,(char *)0x0,0x1cb8d10);
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_2f8.field_2._M_allocated_capacity = *psVar6;
        local_2f8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_2f8.field_2._M_allocated_capacity = *psVar6;
        local_2f8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_2f8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_288.m_type.m_name._M_dataplus._M_p = (pointer)&local_288.m_type.m_name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,local_2f8._M_dataplus._M_p,
                 local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
      local_288.m_type.m_locationSize = dVar8;
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.m_type.m_name._M_dataplus._M_p != &local_288.m_type.m_name.field_2) {
        operator_delete(local_288.m_type.m_name._M_dataplus._M_p,
                        local_288.m_type.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if (local_2c8[0] != local_2b8) {
        operator_delete(local_2c8[0],local_2b8[0] + 1);
      }
      iVar7 = iVar7 + 1;
      dVar8 = dVar8 + 1;
    } while (local_2d4 != dVar8);
  }
  s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x0;
  s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
  AttributeLocationTestUtil::runTest
            ((local_2d0->super_TestCase).super_TestNode.m_testCtx,local_2d0->m_renderCtx,&attributes
             ,&noBindings,&bindings,&noBindings,false,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)&s);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)&s);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&bindings);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vec4.m_name._M_dataplus._M_p != &vec4.m_name.field_2) {
    operator_delete(vec4.m_name._M_dataplus._M_p,vec4.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

deInt32 getMaxAttributeLocations (glu::RenderContext& renderCtx)
{
	const glw::Functions& gl = renderCtx.getFunctions();
	deInt32 maxAttribs;

	gl.getIntegerv(GL_MAX_VERTEX_ATTRIBS, &maxAttribs);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

	return maxAttribs;
}